

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::TypeSpecializeFloatBinary
          (GlobOpt *this,Instr *instr,Value *src1Val,Value *src2Val,Value **pDstVal)

{
  code *pcVar1;
  bool bVar2;
  short sVar3;
  BailOutKind BVar4;
  uint sourceContextId;
  uint functionId;
  ValueInfo *pVVar5;
  FloatConstantValueInfo *this_00;
  Value *pVVar6;
  RegOpnd *pRVar7;
  undefined4 *puVar8;
  char16 *pcVar9;
  FloatConstType local_60;
  FloatConstType floatValue;
  bool isFloatConstMissingItem;
  bool convertDstToBool;
  bool skipDst;
  bool skipSrc2;
  bool skipSrc1;
  bool allowUndefinedOrNullSrc2;
  Opnd *pOStack_50;
  bool allowUndefinedOrNullSrc1;
  Opnd *dst;
  Opnd *src2;
  Opnd *src1;
  Value **pDstVal_local;
  Value *src2Val_local;
  Value *src1Val_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  floatValue._7_1_ = 1;
  floatValue._6_1_ = 1;
  floatValue._5_1_ = 0;
  floatValue._4_1_ = 0;
  floatValue._3_1_ = 0;
  floatValue._2_1_ = 0;
  src1 = (Opnd *)pDstVal;
  pDstVal_local = (Value **)src2Val;
  src2Val_local = src1Val;
  src1Val_local = (Value *)instr;
  instr_local = (Instr *)this;
  bVar2 = DoFloatTypeSpec(this);
  if (!bVar2) {
    return false;
  }
  bVar2 = OpCodeAttr::IsInlineBuiltIn((OpCode)src1Val_local[3].valueNumber);
  if (bVar2) {
    if ((short)src1Val_local[3].valueNumber == 0x26a) {
      pVVar5 = ::Value::GetValueInfo((Value *)pDstVal_local);
      floatValue._1_1_ = ValueInfo::IsFloatConstant(pVVar5);
      if ((bool)floatValue._1_1_) {
        pVVar5 = ::Value::GetValueInfo((Value *)pDstVal_local);
        this_00 = ValueInfo::AsFloatConstant(pVVar5);
        local_60 = FloatConstantValueInfo::FloatValue(this_00);
        floatValue._1_1_ = Js::SparseArraySegment<double>::IsMissingItem(&local_60);
      }
      pVVar5 = ::Value::GetValueInfo((Value *)pDstVal_local);
      bVar2 = ValueType::IsLikelyNumber(&pVVar5->super_ValueType);
      if ((!bVar2) || ((floatValue._1_1_ & 1) != 0)) {
        return false;
      }
      floatValue._5_1_ = 1;
      floatValue._3_1_ = 1;
      floatValue._6_1_ = 0;
    }
    goto LAB_005a3d3f;
  }
  sVar3 = (short)src1Val_local[3].valueNumber;
  if (1 < (ushort)(sVar3 - 0xcU)) {
    if ((ushort)(sVar3 - 0x10U) < 4) {
LAB_005a3b70:
      pVVar5 = ::Value::GetValueInfo(src2Val_local);
      bVar2 = ValueType::IsNotNumber(&pVVar5->super_ValueType);
      if (bVar2) {
        return false;
      }
      pVVar5 = ::Value::GetValueInfo((Value *)pDstVal_local);
      bVar2 = ValueType::IsNotNumber(&pVVar5->super_ValueType);
      if (bVar2) {
        return false;
      }
      goto LAB_005a3d3f;
    }
    if (1 < (ushort)(sVar3 - 0x14U)) {
      if (sVar3 == 0x2d) {
        if ((src2Val_local == (Value *)0x0) || (pDstVal_local == (Value **)0x0)) {
          return false;
        }
        pVVar5 = ::Value::GetValueInfo(src2Val_local);
        bVar2 = ValueType::IsLikelyNumber(&pVVar5->super_ValueType);
        if (!bVar2) {
          return false;
        }
        pVVar5 = ::Value::GetValueInfo((Value *)pDstVal_local);
        bVar2 = ValueType::IsLikelyNumber(&pVVar5->super_ValueType);
        if (!bVar2) {
          return false;
        }
        goto LAB_005a3d3f;
      }
      if (((sVar3 == 0x2e) || (sVar3 == 0x30)) || ((ushort)(sVar3 - 0x33U) < 2)) {
        pVVar5 = ::Value::GetValueInfo(src2Val_local);
        bVar2 = ValueType::IsNotNumber(&pVVar5->super_ValueType);
        if (bVar2) {
          return false;
        }
        pVVar5 = ::Value::GetValueInfo((Value *)pDstVal_local);
        bVar2 = ValueType::IsNotNumber(&pVVar5->super_ValueType);
        if (bVar2) {
          return false;
        }
        goto LAB_005a3d3f;
      }
      if (sVar3 != 0x3b) {
        if ((ushort)(sVar3 - 0x3cU) < 4) {
          pVVar5 = ::Value::GetValueInfo(src2Val_local);
          bVar2 = ValueType::IsNotNumber(&pVVar5->super_ValueType);
          if (bVar2) {
            return false;
          }
          pVVar5 = ::Value::GetValueInfo((Value *)pDstVal_local);
          bVar2 = ValueType::IsNotNumber(&pVVar5->super_ValueType);
          if (bVar2) {
            return false;
          }
          floatValue._2_1_ = 1;
          goto LAB_005a3d3f;
        }
        if (2 < (ushort)(sVar3 - 0x40U)) {
          if (3 < (ushort)(sVar3 - 0x194U)) {
            if (3 < (ushort)(sVar3 - 0x198U)) {
              if (sVar3 != 0x1ee) {
                return false;
              }
              floatValue._4_1_ = 1;
              floatValue._3_1_ = 1;
              goto LAB_005a3d3f;
            }
            goto LAB_005a3b70;
          }
          goto LAB_005a3b26;
        }
      }
      pVVar5 = ::Value::GetValueInfo(src2Val_local);
      bVar2 = ValueType::IsNotNumber(&pVVar5->super_ValueType);
      if (bVar2) {
        return false;
      }
      pVVar5 = ::Value::GetValueInfo((Value *)pDstVal_local);
      bVar2 = ValueType::IsNotNumber(&pVVar5->super_ValueType);
      if (bVar2) {
        return false;
      }
      floatValue._7_1_ = 0;
      floatValue._6_1_ = 0;
      floatValue._2_1_ = 1;
      goto LAB_005a3d3f;
    }
  }
LAB_005a3b26:
  pVVar5 = ::Value::GetValueInfo(src2Val_local);
  bVar2 = ValueType::IsNotNumber(&pVVar5->super_ValueType);
  if (!bVar2) {
    pVVar5 = ::Value::GetValueInfo((Value *)pDstVal_local);
    bVar2 = ValueType::IsNotNumber(&pVVar5->super_ValueType);
    if (!bVar2) {
      floatValue._7_1_ = 0;
      floatValue._6_1_ = 0;
LAB_005a3d3f:
      if ((floatValue._5_1_ & 1) == 0) {
        src2 = IR::Instr::GetSrc1((Instr *)src1Val_local);
        BVar4 = BailOutNumberOnly;
        if ((floatValue._7_1_ & 1) != 0) {
          BVar4 = BailOutPrimitiveButString;
        }
        ToFloat64(this,(Instr *)src1Val_local,src2,this->currentBlock,src2Val_local,(IndirOpnd *)0x0
                  ,BVar4);
      }
      if ((floatValue._4_1_ & 1) == 0) {
        dst = IR::Instr::GetSrc2((Instr *)src1Val_local);
        BVar4 = BailOutNumberOnly;
        if ((floatValue._6_1_ & 1) != 0) {
          BVar4 = BailOutPrimitiveButString;
        }
        ToFloat64(this,(Instr *)src1Val_local,dst,this->currentBlock,(Value *)pDstVal_local,
                  (IndirOpnd *)0x0,BVar4);
      }
      if (((floatValue._3_1_ & 1) == 0) &&
         (pOStack_50 = IR::Instr::GetDst((Instr *)src1Val_local), pOStack_50 != (Opnd *)0x0)) {
        if ((floatValue._2_1_ & 1) == 0) {
          pVVar6 = CreateDstUntransferredValue
                             (this,ValueType::Float,(Instr *)src1Val_local,src2Val_local,
                              (Value *)pDstVal_local);
          src1->_vptr_Opnd = (_func_int **)pVVar6;
          bVar2 = IR::Opnd::IsRegOpnd(pOStack_50);
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x2ab7,"(dst->IsRegOpnd())","What else?");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 0;
          }
          pVVar6 = src1Val_local;
          pRVar7 = IR::Opnd::AsRegOpnd(pOStack_50);
          ToFloat64Dst(this,(Instr *)pVVar6,pRVar7,this->currentBlock);
        }
        else {
          pVVar6 = CreateDstUntransferredValue
                             (this,ValueType::Boolean,(Instr *)src1Val_local,src2Val_local,
                              (Value *)pDstVal_local);
          src1->_vptr_Opnd = (_func_int **)pVVar6;
          pRVar7 = IR::Opnd::AsRegOpnd(pOStack_50);
          ToVarRegOpnd(this,pRVar7,this->currentBlock);
        }
      }
      sourceContextId = Func::GetSourceContextId(this->func);
      functionId = Func::GetLocalFunctionId(this->func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,GlobOptPhase,sourceContextId,functionId)
      ;
      if (bVar2) {
        Output::Print(L"TRACE ");
        bVar2 = IsLoopPrePass(this);
        if (bVar2) {
          Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                        (ulong)(this->prePassLoop->loopNumber - 1));
        }
        Output::Print(L": ");
        Output::Print(L"Type specialized to FLOAT: ");
        IR::Instr::Dump((Instr *)src1Val_local);
        Output::Flush();
      }
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,FloatTypeSpecPhase);
      if (bVar2) {
        Output::Print(L"Type specialized to FLOAT: ");
        pcVar9 = Js::OpCodeUtil::GetOpCodeName((OpCode)src1Val_local[3].valueNumber);
        Output::Print(L"%s \n",pcVar9);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::TypeSpecializeFloatBinary(IR::Instr *instr, Value *src1Val, Value *src2Val, Value **pDstVal)
{
    IR::Opnd *src1;
    IR::Opnd *src2;
    IR::Opnd *dst;
    bool allowUndefinedOrNullSrc1 = true;
    bool allowUndefinedOrNullSrc2 = true;

    bool skipSrc1 = false;
    bool skipSrc2 = false;
    bool skipDst = false;
    bool convertDstToBool = false;

    if (!this->DoFloatTypeSpec())
    {
        return false;
    }

    // For inline built-ins we need to do type specialization. Check upfront to avoid duplicating same case labels.
    if (!OpCodeAttr::IsInlineBuiltIn(instr->m_opcode))
    {
        switch (instr->m_opcode)
        {
        case Js::OpCode::Sub_A:
        case Js::OpCode::Mul_A:
        case Js::OpCode::Div_A:
        case Js::OpCode::Expo_A:
            // Avoid if one source is known not to be a number.
            if (src1Val->GetValueInfo()->IsNotNumber() || src2Val->GetValueInfo()->IsNotNumber())
            {
                return false;
            }
            break;

        case Js::OpCode::BrSrEq_A:
        case Js::OpCode::BrSrNeq_A:
        case Js::OpCode::BrEq_A:
        case Js::OpCode::BrNeq_A:
        case Js::OpCode::BrSrNotEq_A:
        case Js::OpCode::BrNotEq_A:
        case Js::OpCode::BrSrNotNeq_A:
        case Js::OpCode::BrNotNeq_A:
            // Avoid if one source is known not to be a number.
            if (src1Val->GetValueInfo()->IsNotNumber() || src2Val->GetValueInfo()->IsNotNumber())
            {
                return false;
            }
            // Undef == Undef, but +Undef != +Undef
            // 0.0 != null, but 0.0 == +null
            //
            // So Bailout on anything but numbers for both src1 and src2
            allowUndefinedOrNullSrc1 = false;
            allowUndefinedOrNullSrc2 = false;
            break;

        case Js::OpCode::BrGt_A:
        case Js::OpCode::BrGe_A:
        case Js::OpCode::BrLt_A:
        case Js::OpCode::BrLe_A:
        case Js::OpCode::BrNotGt_A:
        case Js::OpCode::BrNotGe_A:
        case Js::OpCode::BrNotLt_A:
        case Js::OpCode::BrNotLe_A:
            // Avoid if one source is known not to be a number.
            if (src1Val->GetValueInfo()->IsNotNumber() || src2Val->GetValueInfo()->IsNotNumber())
            {
                return false;
            }
            break;

        case Js::OpCode::Add_A:
            // For Add, we need both sources to be Numbers, otherwise it could be a string concat
            if (!src1Val || !src2Val || !(src1Val->GetValueInfo()->IsLikelyNumber() && src2Val->GetValueInfo()->IsLikelyNumber()))
            {
                return false;
            }
            break;

        case Js::OpCode::ArgOut_A_InlineBuiltIn:
            skipSrc2 = true;
            skipDst = true;
            break;

        case Js::OpCode::CmEq_A:
        case Js::OpCode::CmSrEq_A:
        case Js::OpCode::CmNeq_A:
        case Js::OpCode::CmSrNeq_A:
        {
            if (src1Val->GetValueInfo()->IsNotNumber() || src2Val->GetValueInfo()->IsNotNumber())
            {
                return false;
            }

            allowUndefinedOrNullSrc1 = false;
            allowUndefinedOrNullSrc2 = false;
            convertDstToBool = true;
            break;
        }

        case Js::OpCode::CmLe_A:
        case Js::OpCode::CmLt_A:
        case Js::OpCode::CmGe_A:
        case Js::OpCode::CmGt_A:
        {
            if (src1Val->GetValueInfo()->IsNotNumber() || src2Val->GetValueInfo()->IsNotNumber())
            {
                return false;
            }

            convertDstToBool = true;
            break;
        }
        
        default:
            return false;
        }
    }
    else
    {
        switch (instr->m_opcode)
        {
            case Js::OpCode::InlineArrayPush:
                bool isFloatConstMissingItem = src2Val->GetValueInfo()->IsFloatConstant();

                if(isFloatConstMissingItem)
                {
                    FloatConstType floatValue = src2Val->GetValueInfo()->AsFloatConstant()->FloatValue();
                    isFloatConstMissingItem = Js::SparseArraySegment<double>::IsMissingItem(&floatValue);
                }
                // Don't specialize if the element is not likelyNumber - we will surely bailout
                if(!(src2Val->GetValueInfo()->IsLikelyNumber()) || isFloatConstMissingItem)
                {
                    return false;
                }
                // Only specialize the Second source - element
                skipSrc1 = true;
                skipDst = true;
                allowUndefinedOrNullSrc2 = false;
                break;
        }
    }

    // Make sure the srcs are specialized
    if(!skipSrc1)
    {
        src1 = instr->GetSrc1();
        this->ToFloat64(instr, src1, this->currentBlock, src1Val, nullptr, (allowUndefinedOrNullSrc1 ? IR::BailOutPrimitiveButString : IR::BailOutNumberOnly));
    }

    if (!skipSrc2)
    {
        src2 = instr->GetSrc2();
        this->ToFloat64(instr, src2, this->currentBlock, src2Val, nullptr, (allowUndefinedOrNullSrc2 ? IR::BailOutPrimitiveButString : IR::BailOutNumberOnly));
    }

    if (!skipDst)
    {
        dst = instr->GetDst();
        if (dst)
        {
            if (convertDstToBool)
            {
                *pDstVal = CreateDstUntransferredValue(ValueType::Boolean, instr, src1Val, src2Val);
                ToVarRegOpnd(dst->AsRegOpnd(), currentBlock);
            }
            else
            {
                *pDstVal = CreateDstUntransferredValue(ValueType::Float, instr, src1Val, src2Val);
                AssertMsg(dst->IsRegOpnd(), "What else?");
                this->ToFloat64Dst(instr, dst->AsRegOpnd(), this->currentBlock);
            }
        }
    }

    GOPT_TRACE_INSTR(instr, _u("Type specialized to FLOAT: "));

#if ENABLE_DEBUG_CONFIG_OPTIONS
    if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::FloatTypeSpecPhase))
    {
        Output::Print(_u("Type specialized to FLOAT: "));
        Output::Print(_u("%s \n"), Js::OpCodeUtil::GetOpCodeName(instr->m_opcode));
    }
#endif

    return true;
}